

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_exp.cpp
# Opt level: O3

FxExpression * ParseAtan2(FScanner *sc,FName *identifier,PClassActor *cls)

{
  int iVar1;
  FxExpression *x;
  FxExpression *y;
  FxATan2 *this;
  FScriptPosition local_40;
  
  x = ParseExpressionM(sc,cls);
  FScanner::MustGetToken(sc,0x2c);
  y = ParseExpressionM(sc,cls);
  FScanner::MustGetToken(sc,0x29);
  iVar1 = identifier->Index;
  this = (FxATan2 *)FMemArena::Alloc(&FxAlloc,0x38);
  if (iVar1 == 0xe4) {
    FScriptPosition::FScriptPosition(&local_40,sc);
    FxATan2::FxATan2(this,x,y,&local_40);
  }
  else {
    FScriptPosition::FScriptPosition(&local_40,sc);
    FxATan2::FxATan2(this,y,x,&local_40);
  }
  FString::~FString(&local_40.FileName);
  return &this->super_FxExpression;
}

Assistant:

static FxExpression *ParseAtan2(FScanner &sc, FName identifier, PClassActor *cls)
{
	FxExpression *a = ParseExpressionM(sc, cls);
	sc.MustGetToken(',');
	FxExpression *b = ParseExpressionM(sc, cls);
	sc.MustGetToken(')');
	return identifier == NAME_ATan2 ? new FxATan2(a, b, sc) : new FxATan2(b, a, sc);
}